

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O3

bool __thiscall
tchecker::
cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
::operator==(cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
             *this,cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
                   *it)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  
  if (this->_nranges == it->_nranges) {
    pcVar2 = (this->_begins).
             super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (this->_begins).
             super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar3 = (it->_begins).
             super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pcVar1 - (long)pcVar2 ==
        (long)(it->_begins).
              super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) {
      for (; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
        if ((pcVar2->super_const_iterator)._M_current != (pcVar3->super_const_iterator)._M_current)
        {
          return false;
        }
        pcVar3 = pcVar3 + 1;
      }
      pcVar2 = (this->_ends).
               super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (this->_ends).
               super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar3 = (it->_ends).
               super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pcVar1 - (long)pcVar2 ==
          (long)(it->_ends).
                super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) {
        for (; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
          if ((pcVar2->super_const_iterator)._M_current != (pcVar3->super_const_iterator)._M_current
             ) {
            return false;
          }
          pcVar3 = pcVar3 + 1;
        }
        pcVar2 = (this->_its).
                 super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (this->_its).
                 super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar3 = (it->_its).
                 super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pcVar1 - (long)pcVar2 ==
            (long)(it->_its).
                  super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) {
          if (pcVar2 == pcVar1) {
            return true;
          }
          do {
            pcVar4 = pcVar2 + 1;
            bVar5 = (pcVar2->super_const_iterator)._M_current ==
                    (pcVar3->super_const_iterator)._M_current;
            if (!bVar5) {
              return bVar5;
            }
            pcVar3 = pcVar3 + 1;
            pcVar2 = pcVar4;
          } while (pcVar4 != pcVar1);
          return bVar5;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(tchecker::cartesian_iterator_t<R> const & it) const
  {
    return ((_nranges == it._nranges) && (_begins == it._begins) && (_ends == it._ends) && (_its == it._its));
  }